

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fluid.cxx
# Opt level: O1

void delete_cb(Fl_Widget *param_1,void *param_2)

{
  Fl_Type *o;
  
  if (Fl_Type::current == (Fl_Type *)0x0) {
    fl_beep(0);
    return;
  }
  undo_checkpoint();
  set_modflag(1);
  ipasteoffset = 0;
  o = Fl_Type::current;
  do {
    o = o->parent;
    if (o == (Fl_Type *)0x0) {
      delete_all(1);
      return;
    }
  } while (o->selected != '\0');
  delete_all(1);
  select_only(o);
  return;
}

Assistant:

void delete_cb(Fl_Widget *, void *) {
  if (!Fl_Type::current) {
    fl_beep();
    return;
  }
  undo_checkpoint();
  set_modflag(1);
  ipasteoffset = 0;
  Fl_Type *p = Fl_Type::current->parent;
  while (p && p->selected) p = p->parent;
  delete_all(1);
  if (p) select_only(p);
}